

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O2

translator_type * __thiscall
cs::translator_type::add_method
          (translator_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *grammar
          ,method_base *method)

{
  method_base *local_18;
  
  local_18 = method;
  std::
  make_shared<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,cs::method_base*&>
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&stack0xffffffffffffffd8,
             (method_base **)grammar);
  std::__cxx11::
  list<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>,std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>>>
  ::
  emplace_back<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>>
            ((list<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>,std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,cs::method_base*>>>>
              *)this,(shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>
                      *)&stack0xffffffffffffffd8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return this;
}

Assistant:

translator_type &add_method(const std::deque<token_base *> &grammar, method_base *method)
		{
			m_data.emplace_back(std::make_shared<data_type>(grammar, method));
			return *this;
		}